

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

int64_t __thiscall
hta::storage::file::Metric::find_index_on_or_after(Metric *this,TimePoint t,int64_t sz)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *__lhs;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *__lhs_00;
  bool local_142;
  bool local_141;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_138;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_130;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_128;
  rep local_120;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_118;
  reference local_110;
  TimeAggregate *chunk;
  iterator __end4;
  iterator __begin4;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *__range4;
  undefined1 local_d0 [8];
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> level;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_98;
  TimePoint interval_begin_next;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_80;
  TimePoint interval_begin_current;
  duration<long,_std::ratio<1L,_1000000000L>_> interval_next;
  Duration interval;
  Meta m;
  int64_t index;
  type *end;
  type *begin;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_28;
  int64_t sz_local;
  Metric *this_local;
  TimePoint t_local;
  
  local_28.__d.__r = (duration)(duration)sz;
  sz_local = (int64_t)this;
  this_local = (Metric *)
               t.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
  iVar2 = (*(this->super_Metric)._vptr_Metric[0xc])();
  begin = (type *)CONCAT44(extraout_var,iVar2);
  __lhs = &std::get<0ul,hta::Clock::time_point,hta::Clock::time_point>
                     ((pair<hta::Clock::time_point,_hta::Clock::time_point> *)&begin)->
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>;
  __lhs_00 = &std::get<1ul,hta::Clock::time_point,hta::Clock::time_point>
                        ((pair<hta::Clock::time_point,_hta::Clock::time_point> *)&begin)->
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ;
  bVar1 = std::chrono::operator>=
                    (__lhs,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&this_local);
  if (bVar1) {
    t_local.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (duration)0x0;
  }
  else {
    bVar1 = std::chrono::operator<
                      (__lhs_00,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)&this_local);
    if (bVar1) {
      t_local.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            local_28.__d.__r;
    }
    else {
      m.interval_factor = 0;
      (**(this->super_Metric)._vptr_Metric)(&interval);
      interval_next.__r = interval.__r;
      while( true ) {
        interval_begin_current.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               std::chrono::operator*(&interval_next,&m.interval_max.__r);
        interval_begin_next.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               interval_next.__r;
        local_80.__d.__r =
             (duration)interval_begin((TimePoint)this_local,(Duration)interval_next.__r);
        local_98.__d.__r =
             (duration)
             interval_begin((TimePoint)this_local,
                            (Duration)
                            interval_begin_current.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            .__d.__r);
        bVar1 = std::chrono::operator>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)&interval_begin_current,
                           &m.interval_min);
        if (bVar1) {
          level.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)interval_next.__r;
          local_98.__d.__r = (duration)epoch(this,(Duration)interval_next.__r);
        }
        bVar1 = std::chrono::operator!=(&local_80,&local_98);
        if (bVar1) {
          (*(this->super_Metric)._vptr_Metric[6])
                    (local_d0,this,local_98.__d.__r,local_80.__d.__r,interval_next.__r,1);
          __end4 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::begin
                             ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
                              local_d0);
          chunk = (TimeAggregate *)
                  std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::end
                            ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
                             local_d0);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                                             *)&chunk), bVar1) {
            local_110 = __gnu_cxx::
                        __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                        ::operator*(&__end4);
            m.interval_factor = (local_110->aggregate).count + m.interval_factor;
            __gnu_cxx::
            __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
            ::operator++(&__end4);
          }
          std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~vector
                    ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_d0);
        }
        local_120 = interval_next.__r;
        local_118.__d.__r = (duration)epoch(this,(Duration)interval_next.__r);
        bVar1 = std::chrono::operator<=(&local_98,&local_118);
        if (bVar1) break;
        interval_next.__r =
             (rep)interval_begin_current.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r;
      }
      while( true ) {
        local_141 = false;
        if (m.interval_factor < (long)local_28.__d.__r) {
          local_128.__d.__r = (duration)get_raw_ts(this,m.interval_factor);
          local_141 = std::chrono::operator<
                                (&local_128,
                                 (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&this_local);
        }
        if (local_141 == false) break;
        m.interval_factor = m.interval_factor + 1;
      }
      local_142 = true;
      if (m.interval_factor != 0) {
        local_130.__d.__r = (duration)get_raw_ts(this,m.interval_factor - 1);
        local_142 = std::chrono::operator<
                              (&local_130,
                               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&this_local);
      }
      if (local_142 == false) {
        __assert_fail("index == 0 || get_raw_ts(index - 1) < t",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0xeb,
                      "int64_t hta::storage::file::Metric::find_index_on_or_after(TimePoint, int64_t)"
                     );
      }
      local_138.__d.__r = (duration)get_raw_ts(this,m.interval_factor);
      bVar1 = std::chrono::operator>=
                        (&local_138,
                         (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&this_local);
      if (!bVar1) {
        __assert_fail("get_raw_ts(index) >= t",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0xec,
                      "int64_t hta::storage::file::Metric::find_index_on_or_after(TimePoint, int64_t)"
                     );
      }
      t_local.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            m.interval_factor;
    }
  }
  return (duration)
         t_local.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
}

Assistant:

int64_t Metric::find_index_on_or_after(TimePoint t, int64_t sz)
{
    auto [begin, end] = range();
    if (begin >= t)
    {
        return 0;
    }
    if (end < t)
    {
        return sz;
    }

    int64_t index = 0;
    auto m = meta();
    Duration interval = m.interval_min;

    while (true)
    {
        auto interval_next = interval * m.interval_factor;
        auto interval_begin_current = interval_begin(t, interval);
        auto interval_begin_next = interval_begin(t, interval_next);

        if (interval_next > m.interval_max)
        {
            interval_begin_next = epoch(interval);
        }

        if (interval_begin_current != interval_begin_next)
        {
            auto level = this->get(interval_begin_next, interval_begin_current, interval,
                                   { Scope::closed, Scope::open });
            for (const auto& chunk : level)
            {
                index += chunk.aggregate.count;
            }
        }

        if (interval_begin_next <= epoch(interval))
        {
            break;
        }
        interval = interval_next;
    }

    // >= index points are now *before* t
    for (; index < sz && get_raw_ts(index) < t; index++)
        ;

    assert(index == 0 || get_raw_ts(index - 1) < t);
    assert(get_raw_ts(index) >= t);
    return index;
}